

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

Configuration * __thiscall
el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
get<el::Level,el::ConfigurationType>
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,Level *arg1,
          ConfigurationType arg2)

{
  bool bVar1;
  iterator __last;
  Predicate __pred;
  reference ppCVar2;
  ConfigurationType in_EDX;
  Level *in_RSI;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *in_RDI;
  bool bVar3;
  iterator iter;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Predicate local_40;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  in_stack_ffffffffffffffd8;
  Configuration *local_8;
  
  (*(code *)(in_RDI->super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>).
            _M_impl.super__Vector_impl_data._M_start[0xb])();
  __last = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin(in_RDI);
  (*(code *)(in_RDI->super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>).
            _M_impl.super__Vector_impl_data._M_start[0xb])();
  __pred = (Predicate)
           std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end(in_RDI);
  Configuration::Predicate::Predicate(&local_40,*in_RSI,in_EDX);
  ::std::
  find_if<__gnu_cxx::__normal_iterator<el::Configuration**,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>,el::Configuration::Predicate>
            (in_stack_ffffffffffffffd8,
             (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              )__last._M_current,__pred);
  (*(code *)(in_RDI->super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>).
            _M_impl.super__Vector_impl_data._M_start[0xb])();
  std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                      *)in_RDI);
  bVar3 = false;
  if (bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                           *)&stack0xffffffffffffffd8);
    bVar3 = *ppCVar2 != (Configuration *)0x0;
  }
  if (bVar3) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                           *)&stack0xffffffffffffffd8);
    local_8 = *ppCVar2;
  }
  else {
    local_8 = (Configuration *)0x0;
  }
  return local_8;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }